

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_disney(SemanticParser *this,SP *in)

{
  ParamSet *pPVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar5;
  SP SVar6;
  allocator<char> local_59;
  string local_58;
  SP mat;
  
  std::make_shared<pbrt::DisneyMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  peVar2 = mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"color",&local_59);
  syntactic::ParamSet::getParam3f(pPVar1,&(peVar2->color).x,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"anisotropic",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->anisotropic =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"clearcoat",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->clearCoat =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"clearcoatgloss",&local_59)
  ;
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,1.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->clearCoatGloss
       = fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"difftrans",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,1.35);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->diffTrans =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"eta",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,1.2);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->eta = fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"flatness",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.2);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flatness =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"metallic",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->metallic =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"roughness",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.9);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->roughness =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"sheen",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.3);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sheen = fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"sheentint",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.68);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sheenTint =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"spectrans",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->specTrans =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"speculartint",&local_59);
  fVar5 = syntactic::ParamSet::getParam1f(pPVar1,&local_58,0.0);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->specularTint =
       fVar5;
  std::__cxx11::string::~string((string *)&local_58);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"thin",&local_59);
  bVar4 = syntactic::ParamSet::getParamBool(pPVar1,&local_58,true);
  (mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->thin = bVar4;
  std::__cxx11::string::~string((string *)&local_58);
  _Var3 = mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mat.super___shared_ptr<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_disney(pbrt::syntactic::Material::SP in)
  {
    DisneyMaterial::SP mat = std::make_shared<DisneyMaterial>(in->name);

    in->getParam3f(&mat->color.x,"color");
    mat->anisotropic    = in->getParam1f("anisotropic",    0.f );
    mat->clearCoat      = in->getParam1f("clearcoat",      0.f );
    mat->clearCoatGloss = in->getParam1f("clearcoatgloss", 1.f );
    mat->diffTrans      = in->getParam1f("difftrans",      1.35f );
    mat->eta            = in->getParam1f("eta",            1.2f );
    mat->flatness       = in->getParam1f("flatness",       0.2f );
    mat->metallic       = in->getParam1f("metallic",       0.f );
    mat->roughness      = in->getParam1f("roughness",      0.9f );
    mat->sheen          = in->getParam1f("sheen",          0.3f );
    mat->sheenTint      = in->getParam1f("sheentint",      0.68f );
    mat->specTrans      = in->getParam1f("spectrans",      0.f );
    mat->specularTint   = in->getParam1f("speculartint",   0.f );
    mat->thin           = in->getParamBool("thin",           true);
    return mat;
  }